

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniwindow.h
# Opt level: O0

int __thiscall PlatformWindowData::open(PlatformWindowData *this,char *__file,int __oflag,...)

{
  uint uVar1;
  int iVar2;
  Display *pDVar3;
  Window WVar4;
  Atom AVar5;
  ulong uVar6;
  undefined8 uVar7;
  Size2D in_RCX;
  char *__new;
  byte in_R8B;
  undefined8 in_stack_fffffffffffffe98;
  Atom prop;
  Hints hints;
  unsigned_long mask;
  XSetWindowAttributes wa;
  XVisualInfo vi;
  bool Decorated__local;
  wstring *title__local;
  PlatformWindowData *this_local;
  int iStack_20;
  Size2D size__local;
  Pos2D pos__local;
  
  uVar1 = (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  printf("Creating window\n");
  pDVar3 = (Display *)XOpenDisplay(0);
  this->display = pDVar3;
  if (this->display == (Display *)0x0) {
    uVar1 = printf("Cannot open display\n");
    uVar6 = (ulong)uVar1;
    pos__local.x._3_1_ = 0;
  }
  else {
    this->screen = *(int *)(this->display + 0xe0);
    this->visual = *(Visual **)(*(long *)(this->display + 0xe8) + (long)this->screen * 0x80 + 0x40);
    this->depth = *(uint *)(*(long *)(this->display + 0xe8) + (long)this->screen * 0x80 + 0x38);
    iVar2 = XMatchVisualInfo(this->display,this->screen,0x20,4,&wa.cursor);
    if (iVar2 == 0) {
      printf("Visual not found! Default is used.\n");
    }
    else {
      this->visual = (Visual *)wa.cursor;
      this->depth = vi.visualid._4_4_;
      printf("XMatchVisual success!\n");
    }
    if (this->visual->c_class != 4) {
      printf("No TrueColor...\n");
    }
    memset(&mask,0,0x70);
    wa._88_8_ = XCreateColormap(this->display,
                                *(undefined8 *)
                                 (*(long *)(this->display + 0xe8) +
                                  (long)*(int *)(this->display + 0xe0) * 0x80 + 0x10),this->visual,0
                               );
    wa.border_pixmap = 0;
    wa.bit_gravity = 2;
    mask = 0;
    hints.status = 0x2049;
    printf("Depth = %i, x = %i, y = %i\n",(ulong)this->depth,__oflag,(ulong)(uint)__oflag._4_4_);
    iStack_20 = in_RCX.h;
    WVar4 = XCreateWindow(this->display,
                          *(undefined8 *)
                           (*(long *)(this->display + 0xe8) +
                            (long)*(int *)(this->display + 0xe0) * 0x80 + 0x10),__oflag,
                          __oflag._4_4_,(ulong)in_RCX & 0xffffffff,iStack_20,(ulong)uVar1 << 0x20,
                          this->depth,1,this->visual,hints.status,&mask);
    this->handle = WVar4;
    printf("handle = %ld\n",this->handle);
    this->isQuit = false;
    XSelectInput(this->display,this->handle,0xa807f);
    rename(this,__file,__new);
    this->pos = ___oflag;
    this->last_pos = this->pos;
    this->size = in_RCX;
    this->last_size = this->size;
    AVar5 = XInternAtom(this->display,"WM_PROTOCOLS",0);
    this->AWM_PROTOCOLS = AVar5;
    AVar5 = XInternAtom(this->display,"WM_DELETE_WINDOW",0);
    this->AWM_DELETE_WINDOW = AVar5;
    uVar6 = XSetWMProtocols(this->display,this->handle,&this->AWM_DELETE_WINDOW,1);
    if ((in_R8B & 1) == 0) {
      prop = 2;
      hints.functions = 0;
      uVar7 = XInternAtom(this->display,"_MOTIF_WM_HINTS",1);
      uVar6 = XChangeProperty(this->display,this->handle,uVar7,uVar7,0x20,0,&prop,5);
    }
    pos__local.x._3_1_ = 1;
  }
  return (int)CONCAT71((int7)(uVar6 >> 8),pos__local.x._3_1_);
}

Assistant:

bool open(std::wstring const& title_, Pos2D pos_, Size2D size_, bool Decorated_/*, bool FullScreen_*/)
	{
		printf("Creating window\n");

		display = XOpenDisplay(0);
		if(!display){ printf("Cannot open display\n"); return false; }
		screen = DefaultScreen(display);
		visual = DefaultVisual(display, screen);
		depth = DefaultDepth(display, screen);
		XVisualInfo vi;
		if( XMatchVisualInfo(display, screen, 32, TrueColor, &vi) != 0 )
		{
			visual = vi.visual;
			depth = vi.depth;
			printf("XMatchVisual success!\n");
		}
		else
		{
			printf("Visual not found! Default is used.\n");
		}

		if(visual->c_class != TrueColor)
		{
			printf("No TrueColor...\n");
		}

		XSetWindowAttributes wa{};
		wa.colormap = XCreateColormap(display, DefaultRootWindow(display), visual, AllocNone);
		//wa.background_pixel = 0;
		wa.border_pixel = 0;
		wa.backing_store = Always;
		wa.background_pixmap = None;
		//wa.override_redirect = !Decorated_ ? True : False;
		unsigned long mask = /*CWBackPixel | */CWBackPixmap | CWColormap | CWBorderPixel | CWBackingStore;// | CWOverrideRedirect;
		printf("Depth = %i, x = %i, y = %i\n", depth, pos_.x, pos_.y);
		handle = XCreateWindow(display, DefaultRootWindow(display), pos_.x, pos_.y, size_.w, size_.h, 0, depth, InputOutput, visual, mask, &wa);
		printf("handle = %ld\n", handle);
		isQuit = false;
		XSelectInput(display, handle, ExposureMask | StructureNotifyMask | SubstructureNotifyMask //| SubstructureRedirectMask // | */ResizeRedirectMask
			| KeyPressMask | KeyReleaseMask
			| ButtonPressMask | PointerMotionMask| LeaveWindowMask| EnterWindowMask| ButtonReleaseMask );
		
		rename(title_);
		last_pos = pos = pos_;
		last_size = size = size_;

		AWM_PROTOCOLS     = XInternAtom(display, "WM_PROTOCOLS", False);
		AWM_DELETE_WINDOW = XInternAtom(display, "WM_DELETE_WINDOW", False);
		XSetWMProtocols(display, handle, &AWM_DELETE_WINDOW, 1);

		if(!Decorated_)
		{
			struct Hints
			{
				unsigned long   flags;       //Functions 1, Decorations 2, InputMode 4, Status 8
				unsigned long   functions;   //None 0, All 1, Resize 2, Move 4, Minimize 8, Maximize 16, Close 32
				unsigned long   decorations; //None 0, All 1, Border 2, ResizeH 4, Title 8, Menu 16, Minimize 32, Maximize 64
				long            inputMode;   //Modeless = 0, PrimaryApplicationModal = 1, SystemModal = 2, FullApplicationModal = 3
				unsigned long   status;      //TearoffWindow 1
			};
			Hints   hints; hints.flags = 2; hints.decorations = 0;
			Atom    prop = XInternAtom(display,"_MOTIF_WM_HINTS",True);
			XChangeProperty(display, handle, prop, prop, 32, PropModeReplace, (unsigned char*)&hints, 5);
		}
		return true;
	}